

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int integrityCheckResultRow(Vdbe *v)

{
  int iVar1;
  int addr;
  Vdbe *v_local;
  
  sqlite3VdbeAddOp2(v,0x54,3,1);
  iVar1 = sqlite3VdbeCurrentAddr(v);
  iVar1 = sqlite3VdbeAddOp3(v,0x3b,1,iVar1 + 2,1);
  sqlite3VdbeAddOp0(v,0x46);
  return iVar1;
}

Assistant:

static int integrityCheckResultRow(Vdbe *v){
  int addr;
  sqlite3VdbeAddOp2(v, OP_ResultRow, 3, 1);
  addr = sqlite3VdbeAddOp3(v, OP_IfPos, 1, sqlite3VdbeCurrentAddr(v)+2, 1);
  VdbeCoverage(v);
  sqlite3VdbeAddOp0(v, OP_Halt);
  return addr;
}